

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_json_to_str(JSContext *ctx,JSONStringifyContext *jsc,JSValue holder,JSValue val,
                  JSValue indent)

{
  JSValue *pJVar1;
  short sVar2;
  int *piVar3;
  int64_t iVar4;
  JSValue v;
  undefined1 auVar5 [16];
  JSValue JVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  JSRefCountHeader *p_2;
  ulong uVar10;
  void *pvVar11;
  JSValueUnion JVar12;
  int64_t iVar13;
  JSValueUnion JVar14;
  long idx;
  uint32_t c;
  JSRefCountHeader *p;
  JSValue val_00;
  JSValue v_00;
  JSValue JVar15;
  JSValue JVar16;
  JSValue v_01;
  JSValue JVar17;
  JSValue JVar18;
  JSValue val_01;
  JSValue holder_00;
  JSValue holder_01;
  JSRefCountHeader *p_4;
  int64_t local_c0;
  JSValueUnion local_b8;
  int64_t iStack_b0;
  StringBuffer **local_98;
  int64_t len;
  int64_t local_78;
  JSValueUnion local_70;
  undefined1 local_68 [16];
  JSValueUnion local_58 [2];
  JSValueUnion local_48;
  JSValueUnion local_40;
  int64_t local_38;
  
  JVar12 = holder.u;
  auVar5._12_4_ = 0;
  auVar5._0_12_ = local_68._4_12_;
  local_68 = auVar5 << 0x20;
  local_b8.ptr = (void *)(local_b8 << 0x20);
  iStack_b0 = 3;
  local_58 = (JSValueUnion  [2])holder;
  switch((int)holder.tag) {
  case 7:
    if (0x7fefffffffffffff < ((ulong)JVar12.ptr & 0x7fffffffffffffff)) {
      local_58[0].float64 = JVar12.float64 & 0xffffffff00000000;
      local_58[1] = (JSValueUnion)(JSValueUnion)holder.tag;
      holder.tag = 2;
      holder.u.ptr = local_58[0].ptr;
    }
  case 0:
  case 1:
  case 2:
switchD_00128e8f_caseD_0:
    iVar8 = string_buffer_concat_value_free(jsc->b,holder);
    return iVar8;
  case -7:
switchD_00128e8f_caseD_fffffff9:
    holder = JS_ToQuotedStringFree(ctx,holder);
LAB_00128f3b:
    if ((int)holder.tag != 6) goto switchD_00128e8f_caseD_0;
LAB_00128f59:
    local_c0 = 3;
    break;
  default:
    JS_FreeValue(ctx,holder);
    return 0;
  case -1:
    sVar2 = *(short *)((long)JVar12.ptr + 6);
    if (sVar2 == 4) {
      holder = JS_ToNumberFree(ctx,holder);
      goto LAB_00128f3b;
    }
    if (sVar2 == 6) {
      iVar8 = string_buffer_concat_value(jsc->b,*(JSValue *)((long)JVar12.ptr + 0x30));
      _local_b8 = holder;
LAB_00129013:
      JS_FreeValue(ctx,_local_b8);
      return iVar8;
    }
    if (sVar2 == 5) {
      holder = JS_ToStringFree(ctx,holder);
      if ((int)holder.tag != 6) goto switchD_00128e8f_caseD_fffffff9;
      goto LAB_00128f59;
    }
    JVar15 = js_array_includes(ctx,jsc->stack,1,(JSValue *)local_58);
    if ((int)JVar15.tag == 6) goto LAB_00128f59;
    iVar8 = JS_ToBoolFree(ctx,JVar15);
    if (iVar8 != 0) {
      JS_ThrowTypeError(ctx,"circular reference");
      goto LAB_00128f59;
    }
    if (0xfffffff4 < (uint)indent.tag) {
      *(int *)indent.u.ptr = *indent.u.ptr + 1;
    }
    piVar3 = (int *)(jsc->gap).u.ptr;
    JVar15 = jsc->gap;
    if (0xfffffff4 < (uint)(jsc->gap).tag) {
      *piVar3 = *piVar3 + 1;
    }
    local_38 = indent.tag;
    local_68 = (undefined1  [16])JS_ConcatString(ctx,indent,JVar15);
    JVar15.tag = local_68._8_8_;
    JVar12 = local_68._0_8_;
    local_c0 = JVar15.tag;
    if (local_68._8_4_ != 6) {
      local_40 = indent.u;
      local_48 = JVar12;
      if (((int)(jsc->gap).tag == -7) && ((*(uint *)((long)(jsc->gap).u.ptr + 4) & 0x7fffffff) == 0)
         ) {
        pJVar1 = &jsc->empty;
        v_01 = *pJVar1;
        JVar16 = *pJVar1;
        JVar18 = *pJVar1;
        JVar17 = *pJVar1;
        if (0xfffffff4 < (uint)(jsc->empty).tag) {
          *(int *)(pJVar1->u).ptr = *(pJVar1->u).ptr + 1;
          pJVar1 = &jsc->empty;
          JVar6 = *pJVar1;
          JVar16 = JVar17;
          v_01 = *pJVar1;
          if (0xfffffff4 < (uint)(jsc->empty).tag) {
            *(int *)(pJVar1->u).ptr = *(pJVar1->u).ptr + 1;
            JVar16 = JVar18;
            v_01 = JVar6;
          }
        }
      }
      else {
        if (0xfffffff4 < local_68._8_4_) {
          *(int *)JVar12.ptr = *JVar12.ptr + 1;
        }
        JVar16 = JS_ConcatString3(ctx,"\n",(JSValue)local_68,"");
        JVar17.tag = local_78;
        JVar17.u.ptr = local_70.ptr;
        if ((int)JVar16.tag == 6) {
          JVar18 = (JSValue)(ZEXT816(3) << 0x40);
          v_01 = (JSValue)(ZEXT816(3) << 0x40);
          goto LAB_00128f76;
        }
        v_01 = JS_NewString(ctx," ");
        JVar17.tag = local_78;
        JVar17.u.ptr = local_70.ptr;
        if ((int)v_01.tag == 6) {
          JVar18 = (JSValue)(ZEXT816(3) << 0x40);
          goto LAB_00128f76;
        }
      }
      JVar12.ptr = local_58;
      iVar13 = 0;
      JVar17 = js_array_push(ctx,jsc->stack,1,(JSValue *)JVar12.ptr,0);
      iVar8 = check_exception_free(ctx,JVar17);
      if (iVar8 == 0) {
        iVar8 = JS_IsArray(ctx,holder);
        if (-1 < iVar8) {
          if (iVar8 == 0) {
            iVar4 = (jsc->property_list).tag;
            if ((uint)iVar4 == 3) {
              JVar12.float64 = 0.0;
              JVar18 = JS_GetOwnPropertyNames2(ctx,holder,0x11,0);
            }
            else {
              JVar14 = (JSValueUnion)(jsc->property_list).u.ptr;
              JVar6.tag = iVar4;
              JVar6.u.ptr = JVar14.ptr;
              JVar18.tag = iVar4;
              JVar18.u.ptr = JVar14.ptr;
              if (0xfffffff4 < (uint)iVar4) {
                *(int *)JVar14.ptr = *JVar14.ptr + 1;
                JVar18 = JVar6;
              }
            }
            JVar17.tag = local_78;
            JVar17.u.ptr = local_70.ptr;
            if ((int)JVar18.tag != 6) {
              iVar8 = js_get_length64(ctx,&len,JVar18);
              JVar17.tag = local_78;
              JVar17.u.ptr = local_70.ptr;
              if (iVar8 == 0) {
                string_buffer_putc8(jsc->b,0x7b);
                val_01.tag = iVar13;
                val_01.u.float64 = JVar12.float64;
                JVar12.float64 = 0.0;
                bVar7 = false;
                iVar13 = len;
                if (len < 1) {
                  iVar13 = 0;
                }
                for (idx = 0; JVar14 = val_01.u, iVar13 != idx; idx = idx + 1) {
                  JS_FreeValue(ctx,_local_b8);
                  _local_b8 = JS_GetPropertyInt64(ctx,JVar18,idx);
                  if (local_b8._8_4_ == 6) {
LAB_00129645:
                    JVar17.tag = local_78;
                    JVar17.u.float64 = local_70.float64;
                    goto LAB_00128f76;
                  }
                  if (0xfffffff4 < local_b8._8_4_) {
                    *(int *)local_b8.ptr = *local_b8.ptr + 1;
                  }
                  val_01 = JS_GetPropertyValue(ctx,holder,_local_b8);
                  if ((int)val_01.tag == 6) goto LAB_00129645;
                  JVar12 = (JSValueUnion)holder.tag;
                  JVar17 = js_json_check(ctx,jsc,holder,val_01,_local_b8);
                  if ((int)JVar17.tag != 3) {
                    if ((int)JVar17.tag == 6) goto LAB_00128f76;
                    if (bVar7) {
                      local_78 = JVar17.tag;
                      local_70 = JVar17.u;
                      string_buffer_putc8(jsc->b,0x2c);
                      JVar17.tag = local_78;
                      JVar17.u.float64 = local_70.float64;
                    }
                    local_78 = JVar17.tag;
                    local_70 = JVar17.u;
                    _local_b8 = JS_ToQuotedStringFree(ctx,_local_b8);
                    if (local_b8._8_4_ == 6) {
                      v_00.tag = local_78;
                      v_00.u.ptr = local_70.ptr;
                      JS_FreeValue(ctx,v_00);
                      JVar17.tag = local_78;
                      JVar17.u.ptr = local_70.ptr;
                      goto LAB_00128f76;
                    }
                    string_buffer_concat_value(jsc->b,JVar16);
                    string_buffer_concat_value(jsc->b,_local_b8);
                    string_buffer_putc8(jsc->b,0x3a);
                    string_buffer_concat_value(jsc->b,v_01);
                    holder_01.tag = local_78;
                    holder_01.u.ptr = local_70.ptr;
                    iVar8 = js_json_to_str(ctx,jsc,holder_01,val_01,(JSValue)local_68);
                    JVar12.float64 = 4.94065645841247e-324;
                    bVar7 = true;
                    if (iVar8 != 0) goto LAB_00129645;
                  }
                }
                if (bVar7) {
                  pvVar11 = (jsc->gap).u.ptr;
                  c = 0x7d;
LAB_0012967e:
                  JVar14 = val_01.u;
                  if ((*(uint *)((long)pvVar11 + 4) & 0x7fffffff) != 0) {
LAB_0012969e:
                    local_98 = &jsc->b;
                    string_buffer_putc8(*local_98,10);
                    v.tag = local_38;
                    v.u.float64 = local_40.float64;
                    string_buffer_concat_value(*local_98,v);
                    JVar14 = val_01.u;
                  }
                }
                else {
                  c = 0x7d;
                }
LAB_001296c8:
                iVar9 = JVar12.int32;
                string_buffer_putc8(jsc->b,c);
                iVar8 = 0;
                JVar17 = js_array_pop(ctx,jsc->stack,iVar9,(JSValue *)JVar14.ptr,0);
                iVar9 = check_exception_free(ctx,JVar17);
                JVar17.tag = local_78;
                JVar17.u.float64 = local_70.float64;
                if (iVar9 == 0) {
                  JS_FreeValue(ctx,holder);
                  JS_FreeValue(ctx,JVar18);
                  JS_FreeValue(ctx,JVar16);
                  JS_FreeValue(ctx,v_01);
                  JVar15.u.float64 = local_48.float64;
                  JS_FreeValue(ctx,JVar15);
                  goto LAB_00129013;
                }
              }
            }
            goto LAB_00128f76;
          }
          iVar8 = js_get_length64(ctx,&len,holder);
          JVar17.tag = local_78;
          JVar17.u.ptr = local_70.ptr;
          if (iVar8 != 0) {
            JVar18 = (JSValue)(ZEXT816(3) << 0x40);
            goto LAB_00128f76;
          }
          string_buffer_putc8(jsc->b,0x5b);
          val_01.tag = iVar13;
          val_01.u.float64 = JVar12.float64;
          pvVar11 = (void *)0x0;
          if (0 < len) {
            pvVar11 = (void *)len;
          }
          JVar12.float64 = 0.0;
          do {
            JVar14 = val_01.u;
            if (pvVar11 == JVar12.ptr) {
              if (len < 1) {
                c = 0x5d;
                JVar18 = (JSValue)(ZEXT816(3) << 0x40);
                goto LAB_001296c8;
              }
              if ((int)(jsc->gap).tag != -7) {
                c = 0x5d;
                JVar18 = (JSValue)(ZEXT816(3) << 0x40);
                goto LAB_0012969e;
              }
              pvVar11 = (jsc->gap).u.ptr;
              JVar12.float64 = 1.48219693752374e-323;
              c = 0x5d;
              JVar18 = (JSValue)(ZEXT816(3) << 0x40);
              goto LAB_0012967e;
            }
            if (JVar12.ptr != (void *)0x0) {
              string_buffer_putc8(jsc->b,0x2c);
            }
            string_buffer_concat_value(jsc->b,JVar16);
            val_01 = JS_GetPropertyInt64(ctx,holder,(int64_t)JVar12);
            if ((int)val_01.tag == 6) break;
            JVar14.float64 = (double)JVar12.float64;
            if (JVar12.ptr < (void *)0x80000000) {
              JVar14 = JVar12;
            }
            iVar13 = 7;
            if (JVar12.ptr < (void *)0x80000000) {
              iVar13 = 0;
            }
            val_00.tag = iVar13;
            val_00.u.float64 = JVar14.float64;
            _local_b8 = JS_ToStringFree(ctx,val_00);
            if (local_b8._8_4_ == 6) break;
            JVar17 = js_json_check(ctx,jsc,holder,val_01,_local_b8);
            JS_FreeValue(ctx,_local_b8);
            local_b8.ptr = (void *)(local_b8 << 0x20);
            iStack_b0 = 3;
            uVar10 = JVar17.tag & 0xffffffff;
            if (uVar10 == 6) break;
            JVar14.float64 = 0.0;
            if (uVar10 != 3) {
              JVar14 = JVar17.u;
            }
            uVar10 = 2;
            if ((int)JVar17.tag != 3) {
              uVar10 = JVar17.tag;
            }
            holder_00.tag = uVar10;
            holder_00.u.float64 = JVar14.float64;
            iVar8 = js_json_to_str(ctx,jsc,holder_00,val_01,(JSValue)local_68);
            JVar12.float64 = JVar12.float64 + 1;
          } while (iVar8 == 0);
        }
      }
      JVar17.tag = local_78;
      JVar17.u.ptr = local_70.ptr;
      JVar18 = (JSValue)(ZEXT816(3) << 0x40);
      goto LAB_00128f76;
    }
  }
  JVar17.tag = local_78;
  JVar17.u.float64 = local_70.float64;
  JVar18 = (JSValue)(ZEXT816(3) << 0x40);
  v_01 = (JSValue)(ZEXT816(3) << 0x40);
  JVar16 = (JSValue)(ZEXT816(3) << 0x40);
LAB_00128f76:
  local_78 = JVar17.tag;
  local_70 = JVar17.u;
  JS_FreeValue(ctx,holder);
  JS_FreeValue(ctx,JVar18);
  JS_FreeValue(ctx,JVar16);
  JS_FreeValue(ctx,v_01);
  JVar16.tag = local_c0;
  JVar16.u = (JSValueUnion)local_68._0_8_;
  JS_FreeValue(ctx,JVar16);
  JS_FreeValue(ctx,_local_b8);
  return -1;
}

Assistant:

static int js_json_to_str(JSContext *ctx, JSONStringifyContext *jsc,
                          JSValueConst holder, JSValue val,
                          JSValueConst indent)
{
    JSValue indent1, sep, sep1, tab, v, prop;
    JSObject *p;
    int64_t i, len;
    int cl, ret;
    BOOL has_content;
    
    indent1 = JS_UNDEFINED;
    sep = JS_UNDEFINED;
    sep1 = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    prop = JS_UNDEFINED;

    switch (JS_VALUE_GET_NORM_TAG(val)) {
    case JS_TAG_OBJECT:
        p = JS_VALUE_GET_OBJ(val);
        cl = p->class_id;
        if (cl == JS_CLASS_STRING) {
            val = JS_ToStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            val = JS_ToQuotedStringFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_NUMBER) {
            val = JS_ToNumberFree(ctx, val);
            if (JS_IsException(val))
                goto exception;
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BOOLEAN) {
            ret = string_buffer_concat_value(jsc->b, p->u.object_data);
            JS_FreeValue(ctx, val);
            return ret;
        }
#ifdef CONFIG_BIGNUM
        else if (cl == JS_CLASS_BIG_FLOAT) {
            return string_buffer_concat_value_free(jsc->b, val);
        } else if (cl == JS_CLASS_BIG_INT) {
            JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
            goto exception;
        }
#endif
        v = js_array_includes(ctx, jsc->stack, 1, (JSValueConst *)&val);
        if (JS_IsException(v))
            goto exception;
        if (JS_ToBoolFree(ctx, v)) {
            JS_ThrowTypeError(ctx, "circular reference");
            goto exception;
        }
        indent1 = JS_ConcatString(ctx, JS_DupValue(ctx, indent), JS_DupValue(ctx, jsc->gap));
        if (JS_IsException(indent1))
            goto exception;
        if (!JS_IsEmptyString(jsc->gap)) {
            sep = JS_ConcatString3(ctx, "\n", JS_DupValue(ctx, indent1), "");
            if (JS_IsException(sep))
                goto exception;
            sep1 = JS_NewString(ctx, " ");
            if (JS_IsException(sep1))
                goto exception;
        } else {
            sep = JS_DupValue(ctx, jsc->empty);
            sep1 = JS_DupValue(ctx, jsc->empty);
        }
        v = js_array_push(ctx, jsc->stack, 1, (JSValueConst *)&val, 0);
        if (check_exception_free(ctx, v))
            goto exception;
        ret = JS_IsArray(ctx, val);
        if (ret < 0)
            goto exception;
        if (ret) {
            if (js_get_length64(ctx, &len, val))
                goto exception;
            string_buffer_putc8(jsc->b, '[');
            for(i = 0; i < len; i++) {
                if (i > 0)
                    string_buffer_putc8(jsc->b, ',');
                string_buffer_concat_value(jsc->b, sep);
                v = JS_GetPropertyInt64(ctx, val, i);
                if (JS_IsException(v))
                    goto exception;
                /* XXX: could do this string conversion only when needed */
                prop = JS_ToStringFree(ctx, JS_NewInt64(ctx, i));
                if (JS_IsException(prop))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                JS_FreeValue(ctx, prop);
                prop = JS_UNDEFINED;
                if (JS_IsException(v))
                    goto exception;
                if (JS_IsUndefined(v))
                    v = JS_NULL;
                if (js_json_to_str(ctx, jsc, val, v, indent1))
                    goto exception;
            }
            if (len > 0 && !JS_IsEmptyString(jsc->gap)) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, ']');
        } else {
            if (!JS_IsUndefined(jsc->property_list))
                tab = JS_DupValue(ctx, jsc->property_list);
            else
                tab = js_object_keys(ctx, JS_UNDEFINED, 1, (JSValueConst *)&val, JS_ITERATOR_KIND_KEY);
            if (JS_IsException(tab))
                goto exception;
            if (js_get_length64(ctx, &len, tab))
                goto exception;
            string_buffer_putc8(jsc->b, '{');
            has_content = FALSE;
            for(i = 0; i < len; i++) {
                JS_FreeValue(ctx, prop);
                prop = JS_GetPropertyInt64(ctx, tab, i);
                if (JS_IsException(prop))
                    goto exception;
                v = JS_GetPropertyValue(ctx, val, JS_DupValue(ctx, prop));
                if (JS_IsException(v))
                    goto exception;
                v = js_json_check(ctx, jsc, val, v, prop);
                if (JS_IsException(v))
                    goto exception;
                if (!JS_IsUndefined(v)) {
                    if (has_content)
                        string_buffer_putc8(jsc->b, ',');
                    prop = JS_ToQuotedStringFree(ctx, prop);
                    if (JS_IsException(prop)) {
                        JS_FreeValue(ctx, v);
                        goto exception;
                    }
                    string_buffer_concat_value(jsc->b, sep);
                    string_buffer_concat_value(jsc->b, prop);
                    string_buffer_putc8(jsc->b, ':');
                    string_buffer_concat_value(jsc->b, sep1);
                    if (js_json_to_str(ctx, jsc, val, v, indent1))
                        goto exception;
                    has_content = TRUE;
                }
            }
            if (has_content && JS_VALUE_GET_STRING(jsc->gap)->len != 0) {
                string_buffer_putc8(jsc->b, '\n');
                string_buffer_concat_value(jsc->b, indent);
            }
            string_buffer_putc8(jsc->b, '}');
        }
        if (check_exception_free(ctx, js_array_pop(ctx, jsc->stack, 0, NULL, 0)))
            goto exception;
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, tab);
        JS_FreeValue(ctx, sep);
        JS_FreeValue(ctx, sep1);
        JS_FreeValue(ctx, indent1);
        JS_FreeValue(ctx, prop);
        return 0;
    case JS_TAG_STRING:
        val = JS_ToQuotedStringFree(ctx, val);
        if (JS_IsException(val))
            goto exception;
        goto concat_value;
    case JS_TAG_FLOAT64:
        if (!isfinite(JS_VALUE_GET_FLOAT64(val))) {
            val = JS_NULL;
        }
        goto concat_value;
    case JS_TAG_INT:
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_FLOAT:
#endif
    case JS_TAG_BOOL:
    case JS_TAG_NULL:
    concat_value:
        return string_buffer_concat_value_free(jsc->b, val);
#ifdef CONFIG_BIGNUM
    case JS_TAG_BIG_INT:
        JS_ThrowTypeError(ctx, "bigint are forbidden in JSON.stringify");
        goto exception;
#endif
    default:
        JS_FreeValue(ctx, val);
        return 0;
    }
    
exception:
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, sep1);
    JS_FreeValue(ctx, indent1);
    JS_FreeValue(ctx, prop);
    return -1;
}